

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ImageBox * __thiscall ImageBox::writeXml_abi_cxx11_(ImageBox *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  Util local_2c8 [32];
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  NinePatchMargin local_260 [2];
  Util local_240 [39];
  allocator local_219;
  string local_218 [32];
  Util local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  ImageBox *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar1 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar1,"<ImageBox");
  std::__cxx11::string::~string((string *)local_1c8);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"imageScaleType",&local_219);
  Util::toString_abi_cxx11_
            (local_240,
             *(ImageScaleType *)
              &this_00[1].children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  Util::writeXmlAttribute<std::__cxx11::string>
            (local_1f8,(stringstream *)local_1a8,(string *)local_218,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  poVar1 = std::operator<<(local_198,">");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  NinePatchMargin::writeXml_abi_cxx11_(local_260,indent + 0xcc);
  std::operator<<(local_198,(string *)local_260);
  std::__cxx11::string::~string((string *)local_260);
  indent_00 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"Image",&local_281);
  std::__cxx11::string::string(local_2a8,(string *)(this_00 + 1));
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1a8,indent_00,(string *)local_280,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  Widget::writeXmlElements(this_00,(stringstream *)local_1a8,local_1c + 1);
  if (this_00->numChildren < 1) {
    Util::getIndent_abi_cxx11_(local_2c8,local_1c);
    poVar1 = std::operator<<(local_198,(string *)local_2c8);
    std::operator<<(poVar1,"</ImageBox>");
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::stringstream::str();
  }
  else {
    Widget::writeXmlChildren(this_00,(stringstream *)local_1a8,local_1c);
    std::__cxx11::stringstream::str();
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string ImageBox::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ImageBox";
	writeXmlAttributes(str);
	Util::writeXmlAttribute(str, "imageScaleType", Util::toString(imageScaleType));
	str << ">" << std::endl;
	str << ninePatchMargin.writeXml(indent + 1);
	Util::writeXmlElement(str, indent + 1, "Image", image);

	Widget::writeXmlElements(str, indent + 1);

	if (numChildren <= 0)
	{
		str << Util::getIndent(indent) << "</ImageBox>";
		return str.str();
	}

	writeXmlChildren(str, indent);

	return str.str();
}